

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

bool __thiscall QListModel::removeRows(QListModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  QListWidgetItem *pQVar3;
  int r;
  ulong i;
  int iVar4;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row && 0 < count) {
    iVar4 = count + row;
    local_48 = 0xffffffffffffffff;
    local_40 = 0;
    uStack_38 = 0;
    iVar2 = (**(code **)(*(long *)this + 0x78))();
    if ((iVar4 <= iVar2) &&
       (((parent->r < 0 || (parent->c < 0)) || ((parent->m).ptr == (QAbstractItemModel *)0x0)))) {
      local_48 = 0xffffffffffffffff;
      local_40 = 0;
      uStack_38 = 0;
      QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_48,row);
      i = (ulong)(uint)row;
      do {
        pQVar3 = QList<QListWidgetItem_*>::takeAt(&this->items,i);
        pQVar3->view = (QListWidget *)0x0;
        pQVar3->d->theid = -1;
        (*pQVar3->_vptr_QListWidgetItem[1])(pQVar3);
        row = row + 1;
      } while (row < iVar4);
      QAbstractItemModel::endRemoveRows();
      bVar1 = true;
      goto LAB_0057aae6;
    }
  }
  bVar1 = false;
LAB_0057aae6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QListModel::removeRows(int row, int count, const QModelIndex &parent)
{
    if (count < 1 || row < 0 || (row + count) > rowCount() || parent.isValid())
        return false;

    beginRemoveRows(QModelIndex(), row, row + count - 1);
    QListWidgetItem *itm = nullptr;
    for (int r = row; r < row + count; ++r) {
        itm = items.takeAt(row);
        itm->view = nullptr;
        itm->d->theid = -1;
        delete itm;
    }
    endRemoveRows();
    return true;
}